

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_InitSubSystem(Uint32 sdl12flags)

{
  int iVar1;
  Uint32 f20_4;
  Uint32 f12_4;
  Uint32 f20_3;
  Uint32 f12_3;
  Uint32 f20_2;
  Uint32 f12_2;
  Uint32 f20_1;
  Uint32 f12_1;
  Uint32 f20;
  Uint32 f12;
  int rc;
  Uint32 sdl20flags;
  Uint32 sdl12flags_local;
  
  f12 = 0;
  if (((sdl12flags & 1) != 0) && ((InitializedSubsystems20 & 1) == 0)) {
    f12 = 1;
  }
  if (((sdl12flags & 0x10) != 0) && ((InitializedSubsystems20 & 0x10) == 0)) {
    f12 = f12 | 0x10;
  }
  if (((sdl12flags & 0x20) != 0) && ((InitializedSubsystems20 & 0x20) == 0)) {
    f12 = f12 | 0x20;
  }
  if (((sdl12flags & 0x200) != 0) && ((InitializedSubsystems20 & 0x200) == 0)) {
    f12 = f12 | 0x200;
  }
  if (((sdl12flags & 0x100000) != 0) && ((InitializedSubsystems20 & 0x100000) == 0)) {
    f12 = f12 | 0x100000;
  }
  if ((sdl12flags & 0x100) != 0) {
    InitializeCDSubsystem();
  }
  f20 = (*SDL20_Init)(f12);
  if ((f20 == 0) && ((f12 & 0x20) != 0)) {
    iVar1 = Init12Video();
    if (iVar1 < 0) {
      f20 = 0xffffffff;
    }
    EventThreadEnabled = (SDL_bool)((sdl12flags & 0x1000000) != 0);
  }
  if ((f20 == 0) && ((f12 & 0x10) != 0)) {
    Init12Audio();
  }
  if ((f20 == 0) && ((f12 & 0x200) != 0)) {
    Init12Joystick();
  }
  InitializedSubsystems20 = f12 | InitializedSubsystems20;
  return f20;
}

Assistant:

SDLCALL
SDL_InitSubSystem(Uint32 sdl12flags)
{
    Uint32 sdl20flags = 0;
    int rc;

#ifdef __WINDOWS__
    /* DOSBox (and probably other things), try to force the "windib" video
       backend, but it doesn't exist in SDL2. Force to "windows" instead. */
    const char *origvidenv = NULL;
    const char *env = SDL20_getenv("SDL_VIDEODRIVER");
    if (env) {
        if (SDL20_strcmp(env, "windib") == 0) {
            origvidenv = "windib";
            SDL20_setenv("SDL_VIDEODRIVER", "windows", 1);
        } else
        if (SDL20_strcmp(env, "directx") == 0) {
            origvidenv = "directx";
            SDL20_setenv("SDL_VIDEODRIVER", "windows", 1);
        }
    }
#endif

#ifdef __MACOSX__
    extern void sdl12_compat_macos_init(void);
    sdl12_compat_macos_init();
#endif

    /* note that currently we ignore SDL12_INIT_NOPARACHUTE, since
       there _isn't_ a parachute in SDL2, and mostly it was meant to deal
       with X11's XVidMode leaving the display resolution busted if the app
       didn't call SDL_Quit() before leaving...but most sdl12-compat cases
       (except OpenGL rendering without logical scaling) use
       FULLSCREEN_DESKTOP for fullscreen modes, and modern X11 doesn't
       have this problem, so we're ignoring the parachute until a reasonable
       need arises. */

    #define SETFLAG(flag) { \
        const Uint32 f12 = SDL12_INIT_##flag; \
        const Uint32 f20 = SDL_INIT_##flag; \
        if ((sdl12flags & f12) && ((InitializedSubsystems20 & f20) == 0)) { \
            sdl20flags |= f20; \
        } \
    }

    SETFLAG(TIMER);
    SETFLAG(AUDIO);
    SETFLAG(VIDEO);
    SETFLAG(JOYSTICK);
    SETFLAG(NOPARACHUTE);
    #undef SETFLAG

    /* There's no CDROM in 2.0, but we fake it. */
    if (sdl12flags & SDL12_INIT_CDROM) {
        /* this never reports failure, even if there's a legit problem. You just won't see any drives. */
        InitializeCDSubsystem();
    }

    rc = SDL20_Init(sdl20flags);
    if ((rc == 0) && (sdl20flags & SDL_INIT_VIDEO)) {
        if (Init12Video() < 0) {
            rc = -1;
        }

        /* SDL_INIT_EVENTTHREAD takes effect when SDL_INIT_VIDEO is also set */
        EventThreadEnabled = (sdl12flags & SDL12_INIT_EVENTTHREAD) ? SDL_TRUE : SDL_FALSE;
    }

#ifdef __WINDOWS__
    if (origvidenv) {  /* set this back to minimize surprise state changes. */
        SDL20_setenv("SDL_VIDEODRIVER", origvidenv, 1);
    }
#endif

    if ((rc == 0) && (sdl20flags & SDL_INIT_AUDIO)) {
        Init12Audio();
    }

    if ((rc == 0) && (sdl20flags & SDL_INIT_JOYSTICK)) {
        Init12Joystick();  /* if this fails, we just won't report any sticks. */
    }

    InitializedSubsystems20 |= sdl20flags;

    return rc;
}